

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeBigIntPrototype
               (DynamicObject *bigIntPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  DeferredTypeHandlerBase::Convert(typeHandler,bigIntPrototype,mode,1,0);
  (*(bigIntPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (bigIntPrototype,0x67,
             (((((bigIntPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).bigIntConstructor.ptr,6,0,0,0);
  DynamicObject::SetHasNoEnumerableProperties(bigIntPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeBigIntPrototype(DynamicObject* bigIntPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        const int numberOfProperties = 1;
        typeHandler->Convert(bigIntPrototype, mode, numberOfProperties);
        // TODO(BigInt): Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterBigInt
        // so that the update is in sync with profiler
        JavascriptLibrary* library = bigIntPrototype->GetLibrary();
        library->AddMember(bigIntPrototype, PropertyIds::constructor, library->bigIntConstructor);

        bigIntPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }